

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

char * upb_MtDataEncoder_PutField
                 (upb_MtDataEncoder *e,char *ptr,upb_FieldType type,uint32_t field_num,
                 uint64_t field_mod)

{
  char *pcVar1;
  uint64_t field_mod_local;
  uint32_t field_num_local;
  upb_FieldType type_local;
  char *ptr_local;
  upb_MtDataEncoder *e_local;
  
  upb_MtDataEncoder_GetInternal(e,ptr);
  pcVar1 = _upb_MtDataEncoder_MaybePutFieldSkip(e,ptr,field_num);
  if (pcVar1 == (char *)0x0) {
    e_local = (upb_MtDataEncoder *)0x0;
  }
  else {
    pcVar1 = _upb_MtDataEncoder_PutFieldType(e,pcVar1,type,field_mod);
    if (pcVar1 == (char *)0x0) {
      e_local = (upb_MtDataEncoder *)0x0;
    }
    else {
      e_local = (upb_MtDataEncoder *)_upb_MtDataEncoder_MaybePutModifiers(e,pcVar1,type,field_mod);
    }
  }
  return (char *)e_local;
}

Assistant:

char* upb_MtDataEncoder_PutField(upb_MtDataEncoder* e, char* ptr,
                                 upb_FieldType type, uint32_t field_num,
                                 uint64_t field_mod) {
  upb_MtDataEncoder_GetInternal(e, ptr);

  ptr = _upb_MtDataEncoder_MaybePutFieldSkip(e, ptr, field_num);
  if (!ptr) return NULL;

  ptr = _upb_MtDataEncoder_PutFieldType(e, ptr, type, field_mod);
  if (!ptr) return NULL;

  return _upb_MtDataEncoder_MaybePutModifiers(e, ptr, type, field_mod);
}